

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O0

NDSTATUS NdDecodeWithContext(INSTRUX *Instrux,ND_UINT8 *Code,ND_SIZET Size,ND_CONTEXT *Context)

{
  long in_FS_OFFSET;
  ulong local_58;
  uint local_48;
  ND_UINT32 opIndex;
  NDSTATUS status;
  ND_CONTEXT *Context_local;
  ND_SIZET Size_local;
  ND_UINT8 *Code_local;
  INSTRUX *Instrux_local;
  ND_IDBE *local_18;
  PND_IDBE pIns;
  
  pIns = *(PND_IDBE *)(in_FS_OFFSET + 0x28);
  local_18 = (ND_IDBE *)0x0;
  if (Instrux == (INSTRUX *)0x0) {
    Instrux_local._4_4_ = 0x80000100;
  }
  else if (Code == (ND_UINT8 *)0x0) {
    Instrux_local._4_4_ = 0x80000100;
  }
  else if (Size == 0) {
    Instrux_local._4_4_ = 0x80000100;
  }
  else if (Context == (ND_CONTEXT *)0x0) {
    Instrux_local._4_4_ = 0x80000100;
  }
  else if (((uint)*(undefined8 *)Context & 0xf) < 3) {
    if (((uint)(*(ulong *)Context >> 4) & 0xf) < 3) {
      if (((uint)(*(ulong *)Context >> 0xc) & 0xf) < 3) {
        if ((Context->Options & 2) == 0) {
          nd_memset(Instrux,0,0x1e8);
        }
        *(uint *)Instrux = *(uint *)Instrux & 0xfffffffc | ((byte)*(undefined8 *)Context & 0xf) & 3;
        *(uint *)Instrux =
             *(uint *)Instrux & 0xfffffff3 | (((byte)(*(ulong *)Context >> 4) & 0xf) & 3) << 2;
        *(uint *)Instrux =
             *(uint *)Instrux & 0xffffffcf |
             (((byte)((ulong)*(undefined8 *)Context >> 8) & 0xf) & 3) << 4;
        *(uint *)Instrux =
             *(uint *)Instrux & 0xfffffff | (uint)((byte)(*(ulong *)Context >> 0xc) & 0xf) << 0x1c;
        Instrux->FeatMode = (ND_UINT8)((ulong)*(undefined8 *)Context >> 0x10);
        *(uint *)Instrux = *(uint *)Instrux & 0xfff0ffff;
        local_48 = 0;
        while( true ) {
          local_58 = Size;
          if (0xe < Size) {
            local_58 = 0xf;
          }
          if (local_58 <= local_48) break;
          Instrux->InstructionBytes[local_48] = Code[local_48];
          local_48 = local_48 + 1;
        }
        if ((((((""[Instrux->InstructionBytes[0]] == '\0') ||
               (Instrux_local._4_4_ = NdFetchPrefixes(Instrux,Instrux->InstructionBytes,'\0',Size),
               Instrux_local._4_4_ < 0x80000000)) &&
              (Instrux_local._4_4_ = NdGetAddrAndOpMode(Instrux), Instrux_local._4_4_ < 0x80000000))
             && ((Instrux_local._4_4_ =
                       NdFindInstruction(Instrux,Instrux->InstructionBytes,Size,&local_18),
                 Instrux_local._4_4_ < 0x80000000 &&
                 (Instrux_local._4_4_ = NdCopyInstructionInfo(Instrux,local_18),
                 Instrux_local._4_4_ < 0x80000000)))) &&
            ((Instrux_local._4_4_ = NdGetEffectiveAddrAndOpMode(Instrux),
             Instrux_local._4_4_ < 0x80000000 &&
             (((*(uint *)&Instrux->field_0x5 >> 4 & 1) == 0 ||
              (Instrux_local._4_4_ = NdGetEvexFields(Instrux), Instrux_local._4_4_ < 0x80000000)))))
            ) && (((Instrux->Attributes & 0x40000) == 0 ||
                  (Instrux_local._4_4_ = NdGetVectorLength(Instrux),
                  Instrux_local._4_4_ < 0x80000000)))) {
          Instrux->field_0x39 = Instrux->field_0x39 & 0xf | local_18->OpsCount << 4;
          Instrux->field_0x39 = Instrux->field_0x39 & 0xf0 | (byte)Instrux->field_0x39 >> 4;
          if ((Context->Options & 1) == 0) {
            Instrux->field_0x39 =
                 Instrux->field_0x39 & 0xf0 |
                 (Instrux->field_0x39 & 0xf) + (char)((int)(uint)local_18->OpsCount >> 4) & 0xf;
          }
          for (local_48 = 0; local_48 < (Instrux->field_0x39 & 0xf); local_48 = local_48 + 1) {
            Instrux_local._4_4_ =
                 NdParseOperand(Instrux,Instrux->InstructionBytes,Instrux->Length,Size,local_48,
                                local_18->Operands[local_48]);
            if (0x7fffffff < Instrux_local._4_4_) goto LAB_0015ec48;
          }
          if ((*(uint *)Instrux >> 0x10 & 0xf) == 0) {
            Instrux_local._4_4_ = NdLegacyPrefixChecks(Instrux);
          }
          else {
            Instrux_local._4_4_ = NdVexExceptionChecks(Instrux);
          }
          if (Instrux_local._4_4_ < 0x80000000) {
            Instrux_local._4_4_ = 0;
          }
        }
      }
      else {
        Instrux_local._4_4_ = 0x80000100;
      }
    }
    else {
      Instrux_local._4_4_ = 0x80000100;
    }
  }
  else {
    Instrux_local._4_4_ = 0x80000100;
  }
LAB_0015ec48:
  if (*(PND_IDBE *)(in_FS_OFFSET + 0x28) == pIns) {
    return Instrux_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

NDSTATUS
NdDecodeWithContext(
    INSTRUX *Instrux,
    const ND_UINT8 *Code,
    ND_SIZET Size,
    ND_CONTEXT *Context
    )
{
    NDSTATUS status;
    PND_IDBE pIns;
    ND_UINT32 opIndex;

    // pre-init
    status = ND_STATUS_SUCCESS;
    pIns = (PND_IDBE)ND_NULL;
    opIndex = 0;

    // validate
    if (ND_NULL == Instrux)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_NULL == Code)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (Size == 0)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_NULL == Context)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_CODE_64 < Context->DefCode)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_DATA_64 < Context->DefData)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (ND_VEND_MAX < Context->VendMode)
    {
        return ND_STATUS_INVALID_PARAMETER;
    }

    if (0 == (Context->Options & ND_OPTION_SKIP_ZERO_INSTRUX))
    {
        // Initialize with zero.
        nd_memzero(Instrux, sizeof(INSTRUX));
    }

    Instrux->DefCode = (ND_UINT8)Context->DefCode;
    Instrux->DefData = (ND_UINT8)Context->DefData;
    Instrux->DefStack = (ND_UINT8)Context->DefStack;
    Instrux->VendMode = (ND_UINT8)Context->VendMode;
    Instrux->FeatMode = (ND_UINT8)Context->FeatMode;
    Instrux->EncMode = ND_ENCM_LEGACY;  // Assume legacy encoding by default.

    // Fetch the instruction bytes.
    for (opIndex = 0; 
         opIndex < ((Size < ND_MAX_INSTRUCTION_LENGTH) ? Size : ND_MAX_INSTRUCTION_LENGTH); 
         opIndex++)
    {
        Instrux->InstructionBytes[opIndex] = Code[opIndex];
    }

    if (gPrefixesMap[Instrux->InstructionBytes[0]] != ND_PREF_CODE_NONE)
    {
        // Fetch prefixes. We peek at the first byte, to see if it's worth calling the prefix decoder.
        status = NdFetchPrefixes(Instrux, Instrux->InstructionBytes, 0, Size);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    // Get addressing mode & operand size.
    status = NdGetAddrAndOpMode(Instrux);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    // Start iterating the tables, in order to extract the instruction entry.
    status = NdFindInstruction(Instrux, Instrux->InstructionBytes, Size, &pIns);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    // Copy information inside the Instrux.
    status = NdCopyInstructionInfo(Instrux, pIns);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    // Get effective operand mode.
    status = NdGetEffectiveAddrAndOpMode(Instrux);
    if (!ND_SUCCESS(status))
    {
        return status;
    }

    if (Instrux->HasEvex)
    {
        // Post-process EVEX encoded instructions. This does two thing:
        // - check and fill in decorator info;
        // - generate error for invalid broadcast/rounding, mask or zeroing bits;
        // - generate error if any reserved bits are set.
        status = NdGetEvexFields(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    if (ND_HAS_VECTOR(Instrux))
    {
        // Get vector length.
        status = NdGetVectorLength(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    Instrux->ExpOperandsCount = ND_EXP_OPS_CNT(pIns->OpsCount);
    Instrux->OperandsCount = Instrux->ExpOperandsCount;

    if (!(Context->Options & ND_OPTION_ONLY_EXPLICIT_OPERANDS))
    {
        Instrux->OperandsCount += ND_IMP_OPS_CNT(pIns->OpsCount);
    }

    // And now decode each operand.
    for (opIndex = 0; opIndex < Instrux->OperandsCount; ++opIndex)
    {
        status = NdParseOperand(Instrux, Instrux->InstructionBytes, Instrux->Length, Size, 
                                opIndex, pIns->Operands[opIndex]);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    if (ND_ENCM_LEGACY == Instrux->EncMode)
    {
        // Do legacy prefix checks. Only available for legacy instructions. For XOP/VEX/EVEX instructions:
        // 1. LOCK, REP, 0x66, REX, REX2 cause #UD (checkd during XOP/VEX/EVEX fetch)
        // 2. Segment prefixes do not have BHINT or DNT semantic
        // 3. 0x67 can be used to override address mode
        // This has to be done after operand parsing, since some #UD conditions depend on them.
        status = NdLegacyPrefixChecks(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }
    else
    {
        // Do XOP/VEX/EVEX encoding checks. Additional #UD conditions, some dependent on encoded registers.
        // This has to be done after operand parsing, since some #UD conditions depend on them.
        status = NdVexExceptionChecks(Instrux);
        if (!ND_SUCCESS(status))
        {
            return status;
        }
    }

    // All done! Instruction successfully decoded!
    return ND_STATUS_SUCCESS;
}